

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Stress::anon_unknown_0::RenderCase::drawTestPattern(RenderCase *this,bool useTexture)

{
  pointer *pppSVar1;
  RenderContext *pRVar2;
  code *pcVar3;
  TestLog *this_00;
  RenderCase *pRVar4;
  RGBA RVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  deUint32 err;
  RenderTarget *pRVar9;
  undefined4 extraout_var;
  ProgramSources *pPVar11;
  long lVar12;
  int x;
  uint uVar13;
  long lVar14;
  ulong __n;
  Surface *pSVar15;
  int y;
  long lVar16;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *__s;
  byte bVar17;
  char *pcVar18;
  int y_1;
  int x_1;
  int iVar19;
  float fVar20;
  uint extraout_XMM0_Db;
  uint uVar21;
  uint extraout_XMM0_Db_00;
  uint extraout_XMM0_Dc;
  uint uVar22;
  uint extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dd;
  uint uVar23;
  uint extraout_XMM0_Dd_00;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  allocator<char> local_40e;
  allocator<char> local_40d;
  allocator<char> local_40c;
  allocator<char> local_40b;
  allocator<char> local_40a;
  allocator<char> local_409;
  string *local_408;
  int local_400;
  int local_3fc;
  RenderCase *local_3f8;
  Surface resultImage;
  RGBA refColGradient;
  RGBA refColTexture;
  undefined1 local_388 [40];
  Surface errorMask;
  RGBA col;
  GLuint textureID;
  string local_320 [56];
  string local_2e8;
  float local_2c8;
  uint uStack_2c4;
  uint uStack_2c0;
  uint uStack_2bc;
  float local_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  string local_2a0;
  vector<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_> buffer;
  ShaderProgram patternProgram;
  long lVar10;
  
  if (Stress::(anonymous_namespace)::RenderCase::drawTestPattern(bool)::fullscreenQuad == '\0') {
    iVar6 = __cxa_guard_acquire(&Stress::(anonymous_namespace)::RenderCase::drawTestPattern(bool)::
                                 fullscreenQuad);
    if (iVar6 != 0) {
      drawTestPattern::fullscreenQuad[0].m_data[0] = _DAT_016753d0;
      drawTestPattern::fullscreenQuad[0].m_data[1] = _UNK_016753d4;
      drawTestPattern::fullscreenQuad[0].m_data[2] = _UNK_016753d8;
      drawTestPattern::fullscreenQuad[0].m_data[3] = _UNK_016753dc;
      drawTestPattern::fullscreenQuad[1].m_data[0] = _DAT_016753c0;
      drawTestPattern::fullscreenQuad[1].m_data[1] = _UNK_016753c4;
      drawTestPattern::fullscreenQuad[1].m_data[2] = _UNK_016753c8;
      drawTestPattern::fullscreenQuad[1].m_data[3] = _UNK_016753cc;
      drawTestPattern::fullscreenQuad[2].m_data[0] = _DAT_016753f0;
      drawTestPattern::fullscreenQuad[2].m_data[1] = _UNK_016753f4;
      drawTestPattern::fullscreenQuad[2].m_data[2] = _UNK_016753f8;
      drawTestPattern::fullscreenQuad[2].m_data[3] = _UNK_016753fc;
      drawTestPattern::fullscreenQuad[3].m_data[0] = _DAT_016753e0;
      drawTestPattern::fullscreenQuad[3].m_data[1] = _UNK_016753e4;
      drawTestPattern::fullscreenQuad[3].m_data[2] = _UNK_016753e8;
      drawTestPattern::fullscreenQuad[3].m_data[3] = _UNK_016753ec;
      __cxa_guard_release(&Stress::(anonymous_namespace)::RenderCase::drawTestPattern(bool)::
                           fullscreenQuad);
    }
  }
  __s = 
  "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_position;\nvoid main ()\n{\n\tfragColor = vec4((v_position.x + 1.0) * 0.5, 1.0, 1.0, 1.0);\n}\n"
  ;
  if (useTexture) {
    __s = 
    "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\nuniform mediump sampler2D u_sampler;\nin mediump vec4 v_position;\nvoid main ()\n{\n\tfragColor = texture(u_sampler, v_position.xy);\n}\n"
    ;
  }
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  RVar5 = tcu::PixelFormat::getColorThreshold(&pRVar9->m_pixelFormat);
  tcu::Surface::Surface(&resultImage,0x100,0x100);
  tcu::Surface::Surface(&errorMask,0x100,0x100);
  patternProgram.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pppSVar1 = &patternProgram.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
  std::operator<<((ostream *)pppSVar1,"Drawing a test pattern to detect ");
  pcVar18 = glcts::fixed_sample_locations_values + 1;
  if (useTexture) {
    pcVar18 = "texture sampling";
  }
  std::operator<<((ostream *)pppSVar1,pcVar18);
  std::operator<<((ostream *)pppSVar1," side-effects.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&patternProgram,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar6);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&buffer,0,0xac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&refColTexture,
             "#version 300 es\nin highp vec4 a_pos;\nout mediump vec4 v_position;\nvoid main ()\n{\n\tv_position = a_pos;\n\tgl_Position = a_pos;\n}\n"
             ,(allocator<char> *)&col);
  glu::VertexSource::VertexSource((VertexSource *)&textureID,(string *)&refColTexture);
  pPVar11 = glu::ProgramSources::operator<<((ProgramSources *)&buffer,(ShaderSource *)&textureID);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&refColGradient,__s,(allocator<char> *)&local_2e8);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_388,(string *)&refColGradient);
  pPVar11 = glu::ProgramSources::operator<<(pPVar11,(ShaderSource *)local_388);
  glu::ShaderProgram::ShaderProgram(&patternProgram,pRVar2,pPVar11);
  std::__cxx11::string::~string((string *)(local_388 + 8));
  local_408 = (string *)&refColGradient;
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string((string *)&refColTexture);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&buffer);
  uVar7 = (**(code **)(lVar10 + 0x780))(patternProgram.m_program.m_program,"a_pos");
  textureID = 0;
  if (useTexture) {
    std::vector<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>::
    vector(&buffer,0x400,(allocator_type *)local_388);
    lVar12 = 0;
    for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 1) {
      fVar27 = (float)(int)lVar14 * 0.03125 + -0.5;
      fVar20 = -fVar27;
      if (-fVar27 <= fVar27) {
        fVar20 = fVar27;
      }
      for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 1) {
        fVar28 = (float)(int)lVar16 * 0.03125 + -0.5;
        fVar27 = -fVar28;
        if (-fVar28 <= fVar28) {
          fVar27 = fVar28;
        }
        fVar28 = fVar27 * 255.0 + fVar20 * 255.0;
        fVar27 = 255.0;
        if (fVar28 <= 255.0) {
          fVar27 = fVar28;
        }
        *(uint *)(buffer.
                  super__Vector_base<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar16].m_data + lVar12) =
             (int)(float)(~-(uint)(fVar28 < 0.0) & (uint)fVar27) | 0xffffff00;
      }
      lVar12 = lVar12 + 0x80;
    }
    (**(code **)(lVar10 + 0x6f8))(1,&textureID);
    (**(code **)(lVar10 + 0xb8))(0xde1,textureID);
    (**(code **)(lVar10 + 0x1310))
              (0xde1,0,0x8058,0x20,0x20,0,0x1908,0x1401,
               buffer.
               super__Vector_base<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    (**(code **)(lVar10 + 0x1360))(0xde1,0x2800,0x2601);
    (**(code **)(lVar10 + 0x1360))(0xde1,0x2801,0x2601);
    std::
    _Vector_base<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>::
    ~_Vector_base(&buffer.
                   super__Vector_base<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>
                 );
  }
  (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar10 + 0x188))(0x4000);
  (**(code **)(lVar10 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar10 + 0x1680))(patternProgram.m_program.m_program);
  if (useTexture) {
    pcVar3 = *(code **)(lVar10 + 0x14f0);
    uVar8 = (**(code **)(lVar10 + 0xb48))(patternProgram.m_program.m_program,"u_sampler");
    (*pcVar3)(uVar8,0);
  }
  (**(code **)(lVar10 + 0x19f0))(uVar7,4,0x1406,0,0,drawTestPattern::fullscreenQuad);
  (**(code **)(lVar10 + 0x610))(uVar7);
  (**(code **)(lVar10 + 0x538))(5,0,4);
  (**(code **)(lVar10 + 0x518))(uVar7);
  (**(code **)(lVar10 + 0x1680))(0);
  (**(code **)(lVar10 + 0x648))();
  err = (**(code **)(lVar10 + 0x800))();
  glu::checkError(err,"RenderCase::drawTestPattern",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x133);
  if (textureID != 0) {
    (**(code **)(lVar10 + 0x480))(1,&textureID);
  }
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_3f8 = this;
  tcu::Surface::getAccess((PixelBufferAccess *)&buffer,&resultImage);
  iVar6 = 0;
  glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)&buffer);
  glu::ShaderProgram::~ShaderProgram(&patternProgram);
  if (useTexture) {
    local_408 = (string *)&refColTexture;
  }
  local_3fc = (RVar5.m_value & 0xff) + 10;
  local_400 = (RVar5.m_value >> 8 & 0xff) + 10;
  uVar13 = (RVar5.m_value >> 0x10 & 0xff) + 10;
  __n = (ulong)uVar13;
  bVar17 = 0;
  uVar24 = extraout_XMM0_Db;
  uVar25 = extraout_XMM0_Dc;
  uVar26 = extraout_XMM0_Dd;
  for (; pRVar4 = local_3f8, iVar6 != 0x100; iVar6 = iVar6 + 1) {
    fVar20 = ((float)iVar6 + (float)iVar6) * 0.00390625;
    fVar27 = floorf(fVar20);
    fVar20 = (fVar20 - fVar27) + -0.5;
    uVar21 = uVar24 ^ 0x80000000;
    uVar22 = uVar25 ^ 0x80000000;
    uVar23 = uVar26 ^ 0x80000000;
    local_2c8 = -fVar20;
    if (-fVar20 <= fVar20) {
      local_2c8 = fVar20;
    }
    local_2c8 = local_2c8 * 255.0;
    uStack_2c4 = uVar21;
    uStack_2c0 = uVar22;
    uStack_2bc = uVar23;
    for (iVar19 = 0; iVar19 != 0x100; iVar19 = iVar19 + 1) {
      fVar27 = (float)iVar19;
      local_2b8 = (fVar27 + fVar27) * 0.00390625;
      uStack_2b4 = uVar24;
      uStack_2b0 = uVar25;
      uStack_2ac = uVar26;
      fVar20 = floorf(local_2b8);
      fVar28 = (local_2b8 - fVar20) + -0.5;
      fVar20 = -fVar28;
      if (-fVar28 <= fVar28) {
        fVar20 = fVar28;
      }
      fVar28 = fVar20 * 255.0 + local_2c8;
      uVar24 = 0;
      uVar25 = 0;
      uVar26 = 0;
      fVar20 = 255.0;
      if (fVar28 <= 255.0) {
        fVar20 = fVar28;
      }
      refColTexture.m_value = (int)(float)(~-(uint)(fVar28 < 0.0) & (uint)fVar20) | 0xffffff00;
      refColGradient.m_value = (int)(fVar27 * 0.00390625 * 255.0) | 0xffffff00;
      col.m_value = *(deUint32 *)
                     ((long)resultImage.m_pixels.m_ptr +
                     (long)(resultImage.m_width * iVar6 + iVar19) * 4);
      tcu::RGBA::toIVec((RGBA *)&textureID);
      tcu::RGBA::toIVec((RGBA *)local_388);
      tcu::operator-((tcu *)&buffer,(Vector<int,_4> *)&textureID,(Vector<int,_4> *)local_388);
      tcu::abs<int,4>((tcu *)&patternProgram,(Vector<int,_4> *)&buffer);
      __n = (ulong)(errorMask.m_width * iVar6 + iVar19);
      uVar7 = 0xff00ff00;
      if ((int)uVar13 <
          (int)patternProgram.m_shaders[0].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_finish ||
          (local_400 <
           patternProgram.m_shaders[0].
           super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
           super__Vector_impl_data._M_start._4_4_ ||
          local_3fc <
          (int)patternProgram.m_shaders[0].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_start)) {
        uVar7 = 0xff0000ff;
      }
      bVar17 = bVar17 | ((int)uVar13 <
                         (int)patternProgram.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish ||
                        (local_400 <
                         patternProgram.m_shaders[0].
                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_ ||
                        local_3fc <
                        (int)patternProgram.m_shaders[0].
                             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                             _M_impl.super__Vector_impl_data._M_start));
      *(undefined4 *)((long)errorMask.m_pixels.m_ptr + __n * 4) = uVar7;
      uVar21 = extraout_XMM0_Db_00;
      uVar22 = extraout_XMM0_Dc_00;
      uVar23 = extraout_XMM0_Dd_00;
    }
    uVar24 = uVar21;
    uVar25 = uVar22;
    uVar26 = uVar23;
  }
  if (bVar17 == 0) {
    patternProgram.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((local_3f8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pppSVar1 = &patternProgram.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::operator<<((ostream *)pppSVar1,"No side-effects found.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&patternProgram,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  }
  else {
    patternProgram.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((local_3f8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pppSVar1 = &patternProgram.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::operator<<((ostream *)pppSVar1,"Test pattern has missing/invalid pixels");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&patternProgram,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
    this_00 = ((pRVar4->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_388,"Results",&local_409);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&refColTexture,"Result verification",&local_40a);
    tcu::LogImageSet::LogImageSet
              ((LogImageSet *)&textureID,(string *)local_388,(string *)&refColTexture);
    iVar6 = (int)this_00;
    tcu::LogImageSet::write((LogImageSet *)&textureID,iVar6,__buf,__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&refColGradient,"Result",&local_40b);
    std::__cxx11::string::string<std::allocator<char>>((string *)&col,"Result",&local_40c);
    pSVar15 = &resultImage;
    tcu::LogImage::LogImage
              ((LogImage *)&patternProgram,(string *)&refColGradient,(string *)&col,pSVar15,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&patternProgram,iVar6,__buf_00,(size_t)pSVar15);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"Error mask",&local_40d)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"Error mask",&local_40e)
    ;
    pSVar15 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&buffer,&local_2e8,&local_2a0,pSVar15,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&buffer,iVar6,__buf_01,(size_t)pSVar15);
    tcu::TestLog::endImageSet(this_00);
    tcu::LogImage::~LogImage((LogImage *)&buffer);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2e8);
    tcu::LogImage::~LogImage((LogImage *)&patternProgram);
    std::__cxx11::string::~string((string *)&col);
    std::__cxx11::string::~string((string *)&refColGradient);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&textureID);
    std::__cxx11::string::~string((string *)&refColTexture);
    std::__cxx11::string::~string((string *)local_388);
  }
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&resultImage);
  return (bool)~bVar17;
}

Assistant:

bool RenderCase::drawTestPattern (bool useTexture)
{
	static const tcu::Vec4 fullscreenQuad[4] =
	{
		tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
	};
	const char* const	vertexSource		=	"#version 300 es\n"
												"in highp vec4 a_pos;\n"
												"out mediump vec4 v_position;\n"
												"void main ()\n"
												"{\n"
												"	v_position = a_pos;\n"
												"	gl_Position = a_pos;\n"
												"}\n";
	const char* const	fragmentSourceNoTex	=	"#version 300 es\n"
												"layout(location = 0) out mediump vec4 fragColor;\n"
												"in mediump vec4 v_position;\n"
												"void main ()\n"
												"{\n"
												"	fragColor = vec4((v_position.x + 1.0) * 0.5, 1.0, 1.0, 1.0);\n"
												"}\n";
	const char* const	fragmentSourceTex	=	"#version 300 es\n"
												"layout(location = 0) out mediump vec4 fragColor;\n"
												"uniform mediump sampler2D u_sampler;\n"
												"in mediump vec4 v_position;\n"
												"void main ()\n"
												"{\n"
												"	fragColor = texture(u_sampler, v_position.xy);\n"
												"}\n";
	const char* const	fragmentSource		=	(useTexture) ? (fragmentSourceTex) : (fragmentSourceNoTex);
	const tcu::RGBA		formatThreshold		= m_context.getRenderTarget().getPixelFormat().getColorThreshold();

	tcu::Surface		resultImage			(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface		errorMask			(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	bool				error				=	false;

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a test pattern to detect " << ((useTexture) ? ("texture sampling") : ("")) << " side-effects." << tcu::TestLog::EndMessage;

	// draw pattern
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	patternProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexSource) << glu::FragmentSource(fragmentSource));
		const GLint					positionLoc		= gl.getAttribLocation(patternProgram.getProgram(), "a_pos");
		GLuint						textureID		= 0;

		if (useTexture)
		{
			const int textureSize = 32;
			std::vector<tcu::Vector<deUint8, 4> > buffer(textureSize*textureSize);

			for (int x = 0; x < textureSize; ++x)
			for (int y = 0; y < textureSize; ++y)
			{
				// sum of two axis aligned gradients. Each gradient is 127 at the edges and 0 at the center.
				// pattern is symmetric (x and y) => no discontinuity near boundary => no need to worry of results with LINEAR filtering near boundaries
				const deUint8 redComponent = (deUint8)de::clamp(de::abs((float)x / (float)textureSize - 0.5f) * 255.0f + de::abs((float)y / (float)textureSize - 0.5f) * 255.0f, 0.0f, 255.0f);

				buffer[x * textureSize + y] = tcu::Vector<deUint8, 4>(redComponent, 255, 255, 255);
			}

			gl.genTextures(1, &textureID);
			gl.bindTexture(GL_TEXTURE_2D, textureID);
			gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, textureSize, textureSize, 0, GL_RGBA, GL_UNSIGNED_BYTE, buffer[0].getPtr());
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		}

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(patternProgram.getProgram());

		if (useTexture)
			gl.uniform1i(gl.getUniformLocation(patternProgram.getProgram(), "u_sampler"), 0);

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &fullscreenQuad[0]);

		gl.enableVertexAttribArray(positionLoc);
		gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
		gl.disableVertexAttribArray(positionLoc);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "RenderCase::drawTestPattern");

		if (textureID)
			gl.deleteTextures(1, &textureID);

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify pattern
	for (int y = 0; y < TEST_CANVAS_SIZE; ++y)
	for (int x = 0; x < TEST_CANVAS_SIZE; ++x)
	{
		const float			texGradientPosX = deFloatFrac((float)x * 2.0f / (float)TEST_CANVAS_SIZE);
		const float			texGradientPosY = deFloatFrac((float)y * 2.0f / (float)TEST_CANVAS_SIZE);
		const deUint8		texRedComponent = (deUint8)de::clamp(de::abs(texGradientPosX - 0.5f) * 255.0f + de::abs(texGradientPosY - 0.5f) * 255.0f, 0.0f, 255.0f);

		const tcu::RGBA		refColTexture	= tcu::RGBA(texRedComponent, 255, 255, 255);
		const tcu::RGBA		refColGradient	= tcu::RGBA((int)((float)x / (float)TEST_CANVAS_SIZE * 255.0f), 255, 255, 255);
		const tcu::RGBA&	refCol			= (useTexture) ? (refColTexture) : (refColGradient);

		const int			colorThreshold	= 10;
		const tcu::RGBA		col				= resultImage.getPixel(x, y);
		const tcu::IVec4	colorDiff		= tcu::abs(col.toIVec() - refCol.toIVec());

		if (colorDiff.x() > formatThreshold.getRed()   + colorThreshold ||
			colorDiff.y() > formatThreshold.getGreen() + colorThreshold ||
			colorDiff.z() > formatThreshold.getBlue()  + colorThreshold)
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			error = true;
		}
		else
			errorMask.setPixel(x, y, tcu::RGBA::green());
	}

	// report error
	if (error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test pattern has missing/invalid pixels" << tcu::TestLog::EndMessage;
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result",		"Result",		resultImage)
			<< tcu::TestLog::Image("Error mask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "No side-effects found." << tcu::TestLog::EndMessage;

	return !error;
}